

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Image * __thiscall
Image::transformLinear(Image *__return_storage_ptr__,Image *this,int s_min,int s_max)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  undefined4 row;
  undefined4 col;
  undefined8 matrix;
  int **ppiVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  Image result;
  
  if ((s_max | s_min) < 0) {
    s_min = this->maxGray;
    if ((long)this->row < 1) {
      s_max = 0;
    }
    else {
      lVar5 = 0;
      s_max = 0;
      do {
        if (0 < this->col) {
          uVar6 = 0;
          do {
            iVar9 = this->matrix[lVar5][uVar6];
            if (s_max < iVar9) {
              s_max = iVar9;
            }
            if (iVar9 < s_min) {
              s_min = iVar9;
            }
            uVar6 = uVar6 + 1;
          } while ((uint)this->col != uVar6);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != this->row);
    }
  }
  local_48._0_4_ = this->row;
  local_48._4_4_ = this->col;
  result.row = this->maxGray;
  uStack_50 = 0x10366d;
  result._8_8_ = clone_matrix<int>(this->matrix,local_48._0_4_,local_48._4_4_);
  lVar5 = -((ulong)(this->maxGray + 1) * 4 + 0xf & 0xfffffffffffffff0);
  uVar1 = this->maxGray;
  if (-1 < (int)uVar1) {
    iVar9 = -(s_min * uVar1);
    lVar7 = 0;
    do {
      *(int *)(local_48 + lVar7 * 4 + lVar5 + -0x48 + 0x48) = iVar9 / (s_max - s_min);
      lVar7 = lVar7 + 1;
      iVar9 = iVar9 + uVar1;
    } while ((ulong)uVar1 + 1 != lVar7);
  }
  if (0 < this->row) {
    ppiVar4 = this->matrix;
    lVar7 = 0;
    do {
      if (0 < this->col) {
        piVar2 = ppiVar4[lVar7];
        lVar3 = *(long *)(result._8_8_ + lVar7 * 8);
        lVar8 = 0;
        do {
          *(undefined4 *)(lVar3 + lVar8 * 4) =
               *(undefined4 *)(local_48 + (long)piVar2[lVar8] * 4 + lVar5 + -0x48 + 0x48);
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->col);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->row);
  }
  *(undefined8 *)((long)&uStack_50 + lVar5) = 0x103711;
  normalize((Image *)local_48);
  matrix = result._8_8_;
  col = local_48._4_4_;
  row = local_48._0_4_;
  __return_storage_ptr__->row = local_48._0_4_;
  __return_storage_ptr__->col = local_48._4_4_;
  __return_storage_ptr__->maxGray = result.row;
  *(undefined8 *)((long)&uStack_50 + lVar5) = 0x10372d;
  ppiVar4 = clone_matrix<int>((int **)matrix,row,col);
  __return_storage_ptr__->matrix = ppiVar4;
  uStack_50 = 0x103740;
  free_matrix<int>((int **)result._8_8_,local_48._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Image Image::transformLinear(int s_min, int s_max)
{
    if(s_min < 0 || s_max < 0)
    {
        s_min=maxGray, s_max=0;
        for (int i = 0; i < row; ++i) {
            for (int j = 0; j < col; ++j) {
                if(matrix[i][j] > s_max)
                    s_max = matrix[i][j];
                if(matrix[i][j] < s_min)
                    s_min = matrix[i][j];
            }
        }
    }

    Image result = clone();
    int LUT[maxGray+1];

    for(int i=0; i<=maxGray; ++i)
    {
        LUT[i] = maxGray*(i - s_min)/(s_max - s_min);
    }

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            result.matrix[i][j] = LUT[matrix[i][j]];
        }
    }

    return result.normalize();
}